

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::ReadStringSize(ON_BinaryArchive *this,size_t *sizeof_string)

{
  ulong uVar1;
  bool bVar2;
  uint in_EAX;
  char *sFormat;
  long lVar3;
  ON_3DM_BIG_CHUNK *pOVar4;
  int line_number;
  ON__UINT32 ui32;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  bVar2 = ReadInt32(this,1,(ON__INT32 *)((long)&uStack_18 + 4));
  if (bVar2) {
    uVar1 = uStack_18 >> 0x20;
    if ((uStack_18 & 0xf00000000000000) == 0) {
      if ((((uVar1 == 0) ||
           (lVar3 = (long)(this->m_chunk).m_count, pOVar4 = (this->m_chunk).m_a + lVar3,
           pOVar4 == (ON_3DM_BIG_CHUNK *)0x28 || lVar3 < 1)) || ((int)pOVar4[-1].m_typecode < 0)) ||
         (-1 < pOVar4[-1].m_big_value && (long)uVar1 <= pOVar4[-1].m_big_value)) {
        *sizeof_string = uVar1;
        return true;
      }
      sFormat = "string element count exceeds current chunk size";
      line_number = 0x604;
    }
    else {
      sFormat = "string element count is impossibly large";
      line_number = 0x5f7;
    }
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,line_number,"",sFormat);
  }
  return false;
}

Assistant:

bool
ON_BinaryArchive::ReadStringSize( // Read size of nullptr terminated string
    size_t* sizeof_string          // (returned size includes nullptr terminator)
    )
{
  ON__UINT32 ui32 = 0;
  bool rc = ReadInt32(1,(ON__INT32*)&ui32);
  // Note that ui32 = number of elements in the string array, including
  // the null terminator.  So ui32 should either be 0 or be >= 2.
  // The string array elements can be chars or unsigned shorts;
  // therefore the number of bytes in the string cannot be determined
  // at this point because we don't know what type of string is
  // being read.
  if (rc)
  {
    // 8 October 2004 Dale Lear
    //    Added the sanity checks on string size to avoid attempts
    //    to allocate huge amounts of memory when the value
    //    comes from a damaged file.
    if ( 0 != (0xF000000 & ui32) )
    {
      // 268 million chars oughta be plenty
      ON_ERROR("string element count is impossibly large");
      rc = false;
    }
    else if ( ui32 > 0 )
    {
      // make sure this is possible
      const ON_3DM_BIG_CHUNK* curchunk = m_chunk.Last();
      if ( 0 != curchunk && 0 == (TCODE_SHORT & curchunk->m_typecode) )
      {
        if (    curchunk->m_big_value < 0 
             || ((ON__INT64)ui32) > curchunk->m_big_value 
           )
        {
          ON_ERROR("string element count exceeds current chunk size");
          rc = false;
        }
      }
    }

    if (rc)
    {
      *sizeof_string = (size_t)ui32;
    }
  }
  return rc;
}